

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O0

duckdb_state
duckdb_prepared_arrow_schema(duckdb_prepared_statement prepared,duckdb_arrow_schema *out_schema)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  pointer __x;
  PreparedStatementData *this;
  ClientProperties *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RDI;
  ArrowSchema *unaff_retaddr;
  ArrowSchema *result_schema;
  string name;
  LogicalTypeId type;
  idx_t i;
  idx_t count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  prepared_names;
  vector<duckdb::LogicalType,_true> prepared_types;
  ClientProperties properties;
  PreparedStatementWrapper *wrapper;
  value_type *in_stack_fffffffffffffef8;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  LogicalType *in_stack_ffffffffffffff20;
  unsigned_long in_stack_ffffffffffffff38;
  ulong local_a0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  duckdb_state dVar4;
  
  if (in_RSI == (ClientProperties *)0x0) {
    dVar4 = DuckDBSuccess;
  }
  else {
    if ((in_RDI != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)0x0) &&
       (bVar3 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                            *)0x190936e), bVar3)) {
      duckdb::
      unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
      operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                  *)in_stack_ffffffffffffff00);
      bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                        ((shared_ptr<duckdb::PreparedStatementData,_true> *)0x1909391);
      if (bVar3) {
        duckdb::
        unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
        ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                      *)in_stack_ffffffffffffff00);
        duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(in_stack_ffffffffffffff00);
        duckdb::ClientContext::GetClientProperties((ClientContext *)i);
        duckdb::vector<duckdb::LogicalType,_true>::vector
                  ((vector<duckdb::LogicalType,_true> *)0x19093db);
        duckdb::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)0x19093e8);
        __x = duckdb::
              unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                            *)in_stack_ffffffffffffff00);
        this = duckdb::shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                         ((shared_ptr<duckdb::PreparedStatementData,_true> *)
                          in_stack_ffffffffffffff00);
        uVar1 = (this->properties).parameter_count;
        for (local_a0 = 0; local_a0 < uVar1; local_a0 = local_a0 + 1) {
          std::__cxx11::to_string(in_stack_ffffffffffffff38);
          duckdb::LogicalType::LogicalType
                    (in_stack_ffffffffffffff20,
                     (LogicalTypeId)((ulong)in_stack_ffffffffffffff18 >> 0x38));
          std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this,
                     in_stack_fffffffffffffef8);
          duckdb::LogicalType::~LogicalType((LogicalType *)0x190948a);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (value_type *)__x);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
        }
        lVar2 = *(long *)&in_RSI->time_zone;
        if (lVar2 == 0) {
          dVar4 = DuckDBError;
        }
        else {
          if (*(long *)(lVar2 + 0x38) != 0) {
            (**(code **)(lVar2 + 0x38))();
          }
          duckdb::ArrowConverter::ToArrowSchema
                    (unaff_retaddr,
                     (vector<duckdb::LogicalType,_true> *)
                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI);
          dVar4 = DuckDBSuccess;
        }
        duckdb::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   *)0x1909591);
        duckdb::vector<duckdb::LogicalType,_true>::~vector
                  ((vector<duckdb::LogicalType,_true> *)0x190959e);
        duckdb::ClientProperties::~ClientProperties((ClientProperties *)0x19095ab);
        return dVar4;
      }
    }
    dVar4 = DuckDBError;
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_prepared_arrow_schema(duckdb_prepared_statement prepared, duckdb_arrow_schema *out_schema) {
	if (!out_schema) {
		return DuckDBSuccess;
	}
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared);
	if (!wrapper || !wrapper->statement || !wrapper->statement->data) {
		return DuckDBError;
	}
	auto properties = wrapper->statement->context->GetClientProperties();
	duckdb::vector<duckdb::LogicalType> prepared_types;
	duckdb::vector<duckdb::string> prepared_names;

	auto count = wrapper->statement->data->properties.parameter_count;
	for (idx_t i = 0; i < count; i++) {
		// Every prepared parameter type is UNKNOWN, which we need to map to NULL according to the spec of
		// 'AdbcStatementGetParameterSchema'
		const auto type = LogicalType::SQLNULL;

		// FIXME: we don't support named parameters yet, but when we do, this needs to be updated
		auto name = std::to_string(i);
		prepared_types.push_back(type);
		prepared_names.push_back(name);
	}

	auto result_schema = (ArrowSchema *)*out_schema;
	if (!result_schema) {
		return DuckDBError;
	}

	if (result_schema->release) {
		// Need to release the existing schema before we overwrite it
		result_schema->release(result_schema);
		D_ASSERT(!result_schema->release);
	}

	ArrowConverter::ToArrowSchema(result_schema, prepared_types, prepared_names, properties);
	return DuckDBSuccess;
}